

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::AddParameter(SQFuncState *this,SQObject *name)

{
  SQObjectPtr local_28;
  SQObject *local_18;
  SQObject *name_local;
  SQFuncState *this_local;
  
  local_18 = name;
  name_local = (SQObject *)this;
  PushLocalVariable(this,name);
  ::SQObjectPtr::SQObjectPtr(&local_28,local_18);
  sqvector<SQObjectPtr>::push_back(&this->_parameters,&local_28);
  ::SQObjectPtr::~SQObjectPtr(&local_28);
  return;
}

Assistant:

void SQFuncState::AddParameter(const SQObject &name)
{
    PushLocalVariable(name);
    _parameters.push_back(name);
}